

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint in_EAX;
  int a;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_852,0x4c);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_28 + 4));
  } while (uStack_28._4_4_ == 0);
  return 0;
}

Assistant:

int main() {
    int a = 0;

    while(0 == a) {
        cout << "Введите число (оно должно отличаться от 0) ";
        cin >> a;
    }

    return 0;
}